

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultVerify.cpp
# Opt level: O0

void mult_verify::MultVerify(void)

{
  ostream *this;
  
  this = std::operator<<((ostream *)&std::cout,"Verifying Multiplication:");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  MultVerifyUint64Uint64();
  MultVerifyUint64Uint();
  MultVerifyUint64Int64();
  MultVerifyUint64Int();
  MultVerifyUintUint64();
  MultVerifyUint32Uint32();
  MultVerifyUintInt64();
  MultVerifyUint32Int32();
  MultVerifyInt64Int64();
  MultVerifyInt64Uint64();
  MultVerifyInt64Int();
  MultVerifyInt64Uint32();
  MultVerifyInt32Uint64();
  MultVerifyInt32Uint32();
  MultVerifyInt32Int64();
  MultVerifyInt32Int32();
  MultVerifyInt8Int8();
  MultVerifyUint8Uint8();
  return;
}

Assistant:

void MultVerify()
{
	std::cout << "Verifying Multiplication:" << std::endl;

	MultVerifyUint64Uint64();
	MultVerifyUint64Uint();
	MultVerifyUint64Int64();
	MultVerifyUint64Int();

	MultVerifyUintUint64();
	MultVerifyUint32Uint32();
	MultVerifyUintInt64();
	MultVerifyUint32Int32();

	MultVerifyInt64Int64();
	MultVerifyInt64Uint64();
	MultVerifyInt64Int();
	MultVerifyInt64Uint32();

	MultVerifyInt32Uint64();
	MultVerifyInt32Uint32();
	MultVerifyInt32Int64();
	MultVerifyInt32Int32();

	// TBD 16 and 8-bit complete
	MultVerifyInt8Int8();
	MultVerifyUint8Uint8();
}